

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.hpp
# Opt level: O1

ostream * dump(ostream *os,block *b)

{
  ostream *poVar1;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"index    = ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"timestamp= ",0xb);
  format_timestamp_abi_cxx11_(&local_48,b->timestamp);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"prevhash = ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(b->prevsha256)._M_dataplus._M_p,(b->prevsha256)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"hash     = ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(b->sha256)._M_dataplus._M_p,(b->sha256)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return os;
}

Assistant:

inline
std::ostream& dump(std::ostream &os, const block &b) {
    os
    << "index    = " << b.idx << std::endl
    << "timestamp= " << format_timestamp(b.timestamp) << std::endl
    << "prevhash = " << b.prevsha256 << std::endl
    << "hash     = " << b.sha256 << std::endl;

    return os;
}